

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CopyPropagateArrays::HasValidReferencesOnly
          (CopyPropagateArrays *this,Instruction *ptr_inst,Instruction *store_inst)

{
  bool bVar1;
  BasicBlock *pBVar2;
  DominatorAnalysis *pDVar3;
  DefUseManager *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pBVar2 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,store_inst);
  pDVar3 = IRContext::GetDominatorAnalysis
                     ((this->super_MemPass).super_Pass.context_,pBVar2->function_);
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x20);
  *(CopyPropagateArrays **)local_50._M_unused._0_8_ = this;
  *(Instruction **)((long)local_50._M_unused._0_8_ + 8) = store_inst;
  *(DominatorAnalysis **)((long)local_50._M_unused._0_8_ + 0x10) = pDVar3;
  *(Instruction **)((long)local_50._M_unused._0_8_ + 0x18) = ptr_inst;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:236:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:236:7)>
             ::_M_manager;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    (this_00,ptr_inst,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::HasValidReferencesOnly(Instruction* ptr_inst,
                                                 Instruction* store_inst) {
  BasicBlock* store_block = context()->get_instr_block(store_inst);
  DominatorAnalysis* dominator_analysis =
      context()->GetDominatorAnalysis(store_block->GetParent());

  return get_def_use_mgr()->WhileEachUser(
      ptr_inst,
      [this, store_inst, dominator_analysis, ptr_inst](Instruction* use) {
        if (use->opcode() == spv::Op::OpLoad ||
            use->opcode() == spv::Op::OpImageTexelPointer) {
          // TODO: If there are many load in the same BB as |store_inst| the
          // time to do the multiple traverses can add up.  Consider collecting
          // those loads and doing a single traversal.
          return dominator_analysis->Dominates(store_inst, use);
        } else if (IsInterpolationInstruction(use)) {
          // GLSL InterpolateAt* instructions work similarly to loads
          uint32_t interpolant = use->GetSingleWordInOperand(kInterpolantInIdx);
          if (interpolant !=
              store_inst->GetSingleWordInOperand(kStorePointerInOperand))
            return false;
          return dominator_analysis->Dominates(store_inst, use);
        } else if (use->opcode() == spv::Op::OpAccessChain) {
          return HasValidReferencesOnly(use, store_inst);
        } else if (use->IsDecoration() || use->opcode() == spv::Op::OpName) {
          return true;
        } else if (use->opcode() == spv::Op::OpStore) {
          // If we are storing to part of the object it is not an candidate.
          return ptr_inst->opcode() == spv::Op::OpVariable &&
                 store_inst->GetSingleWordInOperand(kStorePointerInOperand) ==
                     ptr_inst->result_id();
        } else if (IsDebugDeclareOrValue(use)) {
          return true;
        }
        // Some other instruction.  Be conservative.
        return false;
      });
}